

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O3

int __thiscall
DirectionalScannerO1::nextOnLeft
          (DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pPVar6;
  bool *pbVar7;
  int x;
  int iVar8;
  bool *pbVar9;
  int y;
  Pt2i PStack_38;
  
  if (((this->super_DirectionalScanner).clearance == true) &&
     (pPVar6 = (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
     _M_finish != pPVar6)) {
    (scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pPVar6;
  }
  if (this->lstop == true) {
    y = (this->super_DirectionalScanner).lcy + -1;
    (this->super_DirectionalScanner).lcy = y;
    pbVar9 = (this->super_DirectionalScanner).lst2 + -1;
    (this->super_DirectionalScanner).lst2 = pbVar9;
    pbVar7 = (this->super_DirectionalScanner).steps;
    if (pbVar9 < pbVar7) {
      pbVar9 = (this->super_DirectionalScanner).fs + -1;
      (this->super_DirectionalScanner).lst2 = pbVar9;
    }
    this->lstop = false;
    x = (this->super_DirectionalScanner).lcx;
  }
  else {
    pbVar7 = (this->super_DirectionalScanner).steps;
    pbVar9 = this->lst1 + -1;
    this->lst1 = pbVar9;
    if (pbVar9 < pbVar7) {
      pbVar9 = (this->super_DirectionalScanner).fs + -1;
      this->lst1 = pbVar9;
    }
    iVar1 = (this->super_DirectionalScanner).lcy;
    x = (this->super_DirectionalScanner).lcx + -1;
    (this->super_DirectionalScanner).lcx = x;
    if (*pbVar9 == false) {
      pbVar9 = (this->super_DirectionalScanner).lst2;
      y = iVar1;
    }
    else {
      y = iVar1 + -1;
      (this->super_DirectionalScanner).lcy = y;
      pbVar9 = (this->super_DirectionalScanner).lst2 + -1;
      (this->super_DirectionalScanner).lst2 = pbVar9;
      if (pbVar9 < pbVar7) {
        pbVar9 = (this->super_DirectionalScanner).fs + -1;
        (this->super_DirectionalScanner).lst2 = pbVar9;
      }
      if (*pbVar9 == true) {
        pbVar9 = pbVar9 + 1;
        if ((this->super_DirectionalScanner).fs <= pbVar9) {
          pbVar9 = pbVar7;
        }
        (this->super_DirectionalScanner).lst2 = pbVar9;
        (this->super_DirectionalScanner).lcy = iVar1;
        this->lstop = true;
        y = iVar1;
      }
    }
  }
  iVar1 = (this->super_DirectionalScanner).ymin;
  iVar2 = (this->super_DirectionalScanner).xmax;
  iVar3 = (this->super_DirectionalScanner).dla;
  iVar4 = (this->super_DirectionalScanner).dlb;
  iVar5 = (this->super_DirectionalScanner).dlc2;
  if ((iVar2 <= x) || (y < iVar1)) {
    iVar8 = (y + -1) * iVar4;
    do {
      iVar8 = iVar8 + iVar4;
      if (iVar3 * x + iVar8 < iVar5) break;
      y = y + 1;
      x = x - (uint)*pbVar9;
      pbVar9 = pbVar9 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar9) {
        pbVar9 = pbVar7;
      }
    } while ((iVar2 <= x) || (y < iVar1));
  }
  if ((iVar5 <= iVar4 * y + iVar3 * x) &&
     (((this->super_DirectionalScanner).xmin <= x && (y < (this->super_DirectionalScanner).ymax))))
  {
    do {
      Pt2i::Pt2i(&PStack_38,x,y);
      std::vector<Pt2i,_std::allocator<Pt2i>_>::emplace_back<Pt2i>(scan,&PStack_38);
      pbVar7 = pbVar9 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar7) {
        pbVar7 = (this->super_DirectionalScanner).steps;
      }
      x = x - (uint)*pbVar9;
      y = y + 1;
    } while ((((this->super_DirectionalScanner).dlc2 <=
               (this->super_DirectionalScanner).dlb * y + (this->super_DirectionalScanner).dla * x)
             && ((this->super_DirectionalScanner).xmin <= x)) &&
            (pbVar9 = pbVar7, y < (this->super_DirectionalScanner).ymax));
  }
  return (int)((ulong)((long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int DirectionalScannerO1::nextOnLeft (std::vector<Pt2i> &scan)
{
  // Prepares the next scan
  if (clearance) scan.clear ();
  if (lstop)
  {
    lcy --;
    if (--lst2 < steps) lst2 = fs - 1;
    lstop = false;
  }
  else
  {
    if (--lst1 < steps) lst1 = fs - 1;
    lcx --;
    if (*lst1)
    {
      lcy --;
      if (--lst2 < steps) lst2 = fs - 1;
      if (*lst2)
      {
        if (++lst2 >= fs) lst2 = steps;
        lcy ++;
        lstop = true;
      }
    }
  }

  // Computes the next scan
  int x = lcx;
  int y = lcy;
  bool *nst = lst2;
  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}